

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.cpp
# Opt level: O0

void __thiscall List<Command_*>::RemoveAt(List<Command_*> *this,long index)

{
  long lVar1;
  long local_20;
  long i;
  long index_local;
  List<Command_*> *this_local;
  
  local_20 = index;
  if ((index < 0) || (lVar1 = Count(this), lVar1 <= index)) {
    std::operator<<((ostream *)&std::cout,"Throw RangeException\n");
  }
  for (; lVar1 = Count(this), local_20 < lVar1 + -1; local_20 = local_20 + 1) {
    *(undefined8 *)(*(long *)this + local_20 * 8) =
         *(undefined8 *)(*(long *)this + 8 + local_20 * 8);
  }
  *(long *)(this + 0x10) = *(long *)(this + 0x10) + -1;
  return;
}

Assistant:

void List<Item>::RemoveAt(long index) {
    if (index < 0 || index >= Count())
        std::cout << "Throw RangeException\n";
    for (long i = index; i < Count()-1; i++)
        _items[i] = _items[i+1];
    _count--;
}